

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

void __thiscall QTextBrowser::keyPressEvent(QTextBrowser *this,QKeyEvent *ev)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = QKeyEvent::modifiers();
  if ((uVar2 >> 0x1b & 1) == 0) {
LAB_004af7bc:
    QTextEdit::keyPressEvent(&this->super_QTextEdit,ev);
    return;
  }
  iVar1 = *(int *)(ev + 0x40);
  if (iVar1 == 0x1000012) {
    (**(code **)(*(long *)&(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))(this);
  }
  else if (iVar1 == 0x1000013) {
    (**(code **)(*(long *)&(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x200))(this);
  }
  else {
    if (iVar1 != 0x1000014) goto LAB_004af7bc;
    (**(code **)(*(long *)&(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f8))(this);
  }
  ev[0xc] = (QKeyEvent)0x1;
  return;
}

Assistant:

void QTextBrowser::keyPressEvent(QKeyEvent *ev)
{
#ifdef QT_KEYPAD_NAVIGATION
    Q_D(QTextBrowser);
    switch (ev->key()) {
    case Qt::Key_Select:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            if (!hasEditFocus()) {
                setEditFocus(true);
                return;
            } else {
                QTextCursor cursor = d->control->textCursor();
                QTextCharFormat charFmt = cursor.charFormat();
                if (!cursor.hasSelection() || charFmt.anchorHref().isEmpty()) {
                    ev->accept();
                    return;
                }
            }
        }
        break;
    case Qt::Key_Back:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            if (hasEditFocus()) {
                setEditFocus(false);
                ev->accept();
                return;
            }
        }
        QTextEdit::keyPressEvent(ev);
        return;
    default:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            ev->ignore();
            return;
        }
    }
#endif

    if (ev->modifiers() & Qt::AltModifier) {
        switch (ev->key()) {
        case Qt::Key_Right:
            forward();
            ev->accept();
            return;
        case Qt::Key_Left:
            backward();
            ev->accept();
            return;
        case Qt::Key_Up:
            home();
            ev->accept();
            return;
        }
    }
#ifdef QT_KEYPAD_NAVIGATION
    else {
        if (ev->key() == Qt::Key_Up) {
            d->keypadMove(false);
            return;
        } else if (ev->key() == Qt::Key_Down) {
            d->keypadMove(true);
            return;
        }
    }
#endif
    QTextEdit::keyPressEvent(ev);
}